

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

Result emulator_read_ext_ram_from_file(Emulator *e,char *filename)

{
  Result RVar1;
  FileData file_data;
  
  RVar1 = OK;
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    file_data.data = (u8 *)0x0;
    file_data.size = 0;
    RVar1 = file_read(filename,&file_data);
    if (RVar1 == OK) {
      RVar1 = emulator_read_ext_ram(e,&file_data);
    }
    else {
      RVar1 = ERROR;
    }
    file_data_delete(&file_data);
  }
  return RVar1;
}

Assistant:

Result emulator_read_ext_ram_from_file(Emulator* e, const char* filename) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;
  Result result = ERROR;
  FileData file_data;
  ZERO_MEMORY(file_data);
  CHECK(SUCCESS(file_read(filename, &file_data)));
  CHECK(SUCCESS(emulator_read_ext_ram(e, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}